

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# call_once.h
# Opt level: O1

void absl::lts_20250127::base_internal::
     CallOnceImpl<absl::lts_20250127::(anonymous_namespace)::GetMutexGlobals()::__0>
               (Nonnull<std::atomic<uint32_t>_*> control,SchedulingMode scheduling_mode,
               anon_class_1_0_00000001 *fn)

{
  __int_type_conflict3 _Var1;
  uint32_t uVar2;
  int iVar3;
  Duration *pDVar4;
  bool bVar5;
  Duration rhs;
  Duration local_38;
  
  _Var1 = (control->super___atomic_base<unsigned_int>)._M_i;
  if ((int)_Var1 < 0x5a308d2) {
    if ((_Var1 != 0) && (_Var1 != 0xdd)) {
LAB_01046953:
      raw_log_internal::RawLog(kFatal,"call_once.h",0xa4,"Unexpected value for control word: 0x%lx")
      ;
      __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/base/call_once.h"
                    ,0xa4,
                    "void absl::base_internal::CallOnceImpl(absl::Nonnull<std::atomic<uint32_t> *>, base_internal::SchedulingMode, Callable &&, Args &&...) [Callable = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/synchronization/mutex.cc:148:56), Args = <>]"
                   );
    }
  }
  else if ((_Var1 != 0x5a308d2) && (_Var1 != 0x65c2937b)) goto LAB_01046953;
  LOCK();
  bVar5 = (control->super___atomic_base<unsigned_int>)._M_i == 0;
  if (bVar5) {
    (control->super___atomic_base<unsigned_int>)._M_i = 0x65c2937b;
  }
  UNLOCK();
  if ((bVar5) ||
     (uVar2 = SpinLockWait(control,3,
                           CallOnceImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/synchronization/mutex.cc:148:56)>
                           ::trans,SCHEDULE_KERNEL_ONLY), uVar2 == 0)) {
    iVar3 = NumCPUs();
    if (iVar3 < 2) {
      _DAT_01a09508 = 0;
      rhs = (Duration)Now();
      AbslInternalMutexYield_lts_20250127();
      local_38 = (Duration)Now();
      pDVar4 = Duration::operator-=(&local_38,rhs);
      local_38.rep_hi_ = pDVar4->rep_hi_;
      local_38.rep_lo_ = pDVar4->rep_lo_;
      pDVar4 = Duration::operator*=(&local_38,5);
      local_38 = (Duration)(ZEXT412(4000000) << 0x40);
      bVar5 = 0 < (long)pDVar4->rep_hi_;
      if (pDVar4->rep_hi_ == (HiRep)0x0) {
        bVar5 = 4000000 < pDVar4->rep_lo_;
      }
      pDVar4 = (Duration *)&DAT_01a09510;
      if (bVar5) {
        pDVar4 = &local_38;
      }
      bVar5 = *(long *)pDVar4 < 0;
      if (*(long *)pDVar4 == 0) {
        bVar5 = *(uint *)((long)pDVar4 + 8) < 40000;
      }
      local_38 = (Duration)(ZEXT412(40000) << 0x40);
      pDVar4 = (Duration *)&DAT_01a09510;
      if (bVar5) {
        pDVar4 = &local_38;
      }
      DAT_01a09510 = pDVar4->rep_hi_;
      DAT_01a09518 = *(undefined4 *)((long)pDVar4 + 8);
    }
    else {
      _DAT_01a09508 = 0xfa00001388;
      DAT_01a09510 = 0;
      DAT_01a09518 = 40000;
    }
    LOCK();
    _Var1 = (control->super___atomic_base<unsigned_int>)._M_i;
    (control->super___atomic_base<unsigned_int>)._M_i = 0xdd;
    UNLOCK();
    if (_Var1 == 0x5a308d2) {
      AbslInternalSpinLockWake_lts_20250127(control,true);
    }
  }
  return;
}

Assistant:

void
    CallOnceImpl(absl::Nonnull<std::atomic<uint32_t>*> control,
                 base_internal::SchedulingMode scheduling_mode, Callable&& fn,
                 Args&&... args) {
#ifndef NDEBUG
  {
    uint32_t old_control = control->load(std::memory_order_relaxed);
    if (old_control != kOnceInit &&
        old_control != kOnceRunning &&
        old_control != kOnceWaiter &&
        old_control != kOnceDone) {
      ABSL_RAW_LOG(FATAL, "Unexpected value for control word: 0x%lx",
                   static_cast<unsigned long>(old_control));  // NOLINT
    }
  }
#endif  // NDEBUG
  static const base_internal::SpinLockWaitTransition trans[] = {
      {kOnceInit, kOnceRunning, true},
      {kOnceRunning, kOnceWaiter, false},
      {kOnceDone, kOnceDone, true}};

  // Must do this before potentially modifying control word's state.
  base_internal::SchedulingHelper maybe_disable_scheduling(scheduling_mode);
  // Short circuit the simplest case to avoid procedure call overhead.
  // The base_internal::SpinLockWait() call returns either kOnceInit or
  // kOnceDone. If it returns kOnceDone, it must have loaded the control word
  // with std::memory_order_acquire and seen a value of kOnceDone.
  uint32_t old_control = kOnceInit;
  if (control->compare_exchange_strong(old_control, kOnceRunning,
                                       std::memory_order_relaxed) ||
      base_internal::SpinLockWait(control, ABSL_ARRAYSIZE(trans), trans,
                                  scheduling_mode) == kOnceInit) {
    base_internal::invoke(std::forward<Callable>(fn),
                          std::forward<Args>(args)...);
    old_control =
        control->exchange(base_internal::kOnceDone, std::memory_order_release);
    if (old_control == base_internal::kOnceWaiter) {
      base_internal::SpinLockWake(control, true);
    }
  }  // else *control is already kOnceDone
}